

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O1

int flecs::_::component_info<Rocket_*>::init(EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  int extraout_EAX;
  int iVar2;
  char *__s;
  char in_DL;
  ecs_entity_t in_RSI;
  bool condition;
  
  if (component_info<Rocket*>::s_id == 0) {
    __s = ecs_get_path_w_sep((ecs_world_t *)ctx,0,in_RSI,0,".",(char *)0x0);
    pcVar1 = DAT_00154670;
    component_info<Rocket*>::s_id = in_RSI;
    strlen(__s);
    std::__cxx11::string::_M_replace(0x154668,0,pcVar1,(ulong)__s);
    component_info<Rocket*>::s_allow_tag = in_DL;
    iVar2 = (*ecs_os_api.free_)(__s);
    return iVar2;
  }
  _ecs_assert(component_info<Rocket*>::s_name_abi_cxx11_ != 0,0xc,(char *)0x0,
              "s_name.c_str() != nullptr",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xd79);
  if (component_info<Rocket*>::s_name_abi_cxx11_ == 0) {
    __assert_fail("s_name.c_str() != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xd79,
                  "static void flecs::_::component_info<Rocket *>::init(world_t *, entity_t, bool) [T = Rocket *]"
                 );
  }
  condition = component_info<Rocket*>::s_id == in_RSI;
  name_helper<Rocket*>::name()::typeName._0_8_ = 0x2a2074656b636f52;
  name_util::trim_name(name_helper<Rocket*>::name()::typeName);
  _ecs_assert(condition,0x2d,name_helper<Rocket*>::name()::typeName,"s_id == entity",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xd7d);
  if (component_info<Rocket*>::s_id != in_RSI) {
    __assert_fail("s_id == entity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xd7d,
                  "static void flecs::_::component_info<Rocket *>::init(world_t *, entity_t, bool) [T = Rocket *]"
                 );
  }
  _ecs_assert(component_info<Rocket*>::s_allow_tag == in_DL,0xc,(char *)0x0,
              "allow_tag == s_allow_tag",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xd7f);
  if (component_info<Rocket*>::s_allow_tag == in_DL) {
    return extraout_EAX;
  }
  __assert_fail("allow_tag == s_allow_tag",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xd7f,
                "static void flecs::_::component_info<Rocket *>::init(world_t *, entity_t, bool) [T = Rocket *]"
               );
}

Assistant:

static void init(world_t* world, entity_t entity, bool allow_tag = true) {
        // If an identifier was already set, check for consistency
        if (s_id) {
            // If an identifier was registered, a name should've been registered
            // as well.
            ecs_assert(s_name.c_str() != nullptr, ECS_INTERNAL_ERROR, NULL);

            // A component cannot be registered using a different identifier.
            ecs_assert(s_id == entity, ECS_INCONSISTENT_COMPONENT_ID, 
                _::name_helper<T>::name());

            ecs_assert(allow_tag == s_allow_tag, ECS_INTERNAL_ERROR, NULL);

            // Component was already registered and data is consistent with new
            // identifier, so nothing else to be done.
            return;
        }

        // Component wasn't registered yet, set the values. Register component
        // name as the fully qualified flecs path.
        char *path = ecs_get_fullpath(world, entity);
        s_id = entity;
        s_name = path;
        s_allow_tag = allow_tag;

        // s_name is an std::string, so it will have made a copy
        ecs_os_free(path);
    }